

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::indentationForItem(QTreeViewPrivate *this,int item)

{
  long i;
  qsizetype qVar1;
  const_reference pQVar2;
  int in_ESI;
  QList<QTreeViewItem> *in_RDI;
  int level;
  uint local_18;
  
  if (-1 < in_ESI) {
    i = (long)in_ESI;
    qVar1 = QList<QTreeViewItem>::size(in_RDI + 0x3c);
    if (i < qVar1) {
      pQVar2 = QList<QTreeViewItem>::at(in_RDI,i);
      local_18 = (uint)((ulong)*(undefined8 *)&pQVar2->field_0x1c >> 0x20) & 0xffff;
      if (((ulong)in_RDI[0x3d].d.ptr & 0x100) != 0) {
        local_18 = local_18 + 1;
      }
      return local_18 * (int)in_RDI[0x3b].d.size;
    }
  }
  return 0;
}

Assistant:

int QTreeViewPrivate::indentationForItem(int item) const
{
    if (item < 0 || item >= viewItems.size())
        return 0;
    int level = viewItems.at(item).level;
    if (rootDecoration)
        ++level;
    return level * indent;
}